

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

void __thiscall argo::pointer::token::token(token *this,string *name)

{
  pointer pcVar1;
  
  this->m_type = object_e;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_index = 0;
  return;
}

Assistant:

pointer::token::token(const string &name) : m_type(object_e), m_name(name), m_index(0)
{
}